

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

char __thiscall capnp::anon_unknown_79::Input::nextChar(Input *this)

{
  char cVar1;
  long in_RSI;
  DebugExpression<bool> _kjCondition;
  Fault f;
  
  if (in_RSI == 0) {
    _kjCondition.value = false;
  }
  else {
    cVar1 = *(char *)&(this->wrapped).ptr;
    _kjCondition.value = cVar1 != '\0';
    if (_kjCondition.value) {
      return cVar1;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[31]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x22c,FAILED,"!exhausted()","_kjCondition,\"JSON message ends prematurely.\"",
             &_kjCondition,(char (*) [31])"JSON message ends prematurely.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

bool exhausted() {
    return wrapped.size() == 0 || wrapped.front() == '\0';
  }